

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

LY_ERR lys_parse(ly_ctx *ctx,ly_in *in,LYS_INFORMAT format,char **features,lys_module **module)

{
  lys_glob_unres *unres;
  LY_ERR LVar1;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  ulong uVar5;
  char *pcVar6;
  lys_module *mod;
  char **local_38;
  
  if (module != (lys_module **)0x0) {
    *module = (lys_module *)0x0;
  }
  if (ctx == (ly_ctx *)0x0) {
    pcVar6 = "ctx";
  }
  else {
    if (in != (ly_in *)0x0) {
      if (format != LYS_IN_UNKNOWN) {
LAB_00157160:
        in->func_start = in->current;
        unres = &ctx->unres;
        LVar1 = lys_parse_in(ctx,in,format,
                             (_func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *)
                             0x0,(void *)0x0,&(ctx->unres).creating,&mod);
        if ((LVar1 == LY_SUCCESS) &&
           (LVar1 = _lys_set_implemented(mod,features,unres), LVar1 == LY_SUCCESS)) {
          if ((ctx->flags & 0x80) == 0) {
            LVar1 = lys_unres_dep_sets_create(ctx,&unres->dep_sets,mod);
            if ((LVar1 != LY_SUCCESS) ||
               (LVar1 = lys_compile_depset_all(ctx,unres), LVar1 != LY_SUCCESS)) goto LAB_001571aa;
            lys_unres_glob_erase(unres);
          }
          if (module == (lys_module **)0x0) {
            return LY_SUCCESS;
          }
          *module = mod;
          return LY_SUCCESS;
        }
LAB_001571aa:
        lys_unres_glob_revert(ctx,unres);
        lys_unres_glob_erase(unres);
        return LVar1;
      }
      local_38 = features;
      if (in->type == LY_IN_FILEPATH) {
        pcVar6 = (in->method).fpath.filepath;
        sVar3 = strlen(pcVar6);
        do {
          uVar5 = sVar3;
          if (uVar5 == 0) goto LAB_001572e6;
          ppuVar4 = __ctype_b_loc();
          sVar3 = uVar5 - 1;
        } while ((*(byte *)((long)*ppuVar4 + (long)pcVar6[uVar5 - 1] * 2 + 1) & 0x20) != 0);
        if (uVar5 < 6) {
          if (uVar5 != 5) goto LAB_001572e6;
        }
        else {
          iVar2 = strncmp(pcVar6 + (uVar5 - 5),".yang",5);
          if (iVar2 == 0) {
            format = LYS_IN_YANG;
            features = local_38;
            goto LAB_00157160;
          }
        }
        iVar2 = strncmp(pcVar6 + (uVar5 - 4),".yin",4);
        if (iVar2 == 0) {
          format = LYS_IN_YIN;
          features = local_38;
          goto LAB_00157160;
        }
      }
LAB_001572e6:
      pcVar6 = "format";
      goto LAB_001571eb;
    }
    pcVar6 = "in";
  }
  ctx = (ly_ctx *)0x0;
LAB_001571eb:
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar6,"lys_parse");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_parse(struct ly_ctx *ctx, struct ly_in *in, LYS_INFORMAT format, const char **features, struct lys_module **module)
{
    LY_ERR ret = LY_SUCCESS;
    struct lys_module *mod;

    if (module) {
        *module = NULL;
    }
    LY_CHECK_ARG_RET(NULL, ctx, in, LY_EINVAL);

    format = lys_parse_get_format(in, format);
    LY_CHECK_ARG_RET(ctx, format, LY_EINVAL);

    /* remember input position */
    in->func_start = in->current;

    /* parse */
    ret = lys_parse_in(ctx, in, format, NULL, NULL, &ctx->unres.creating, &mod);
    LY_CHECK_GOTO(ret, cleanup);

    /* implement */
    ret = _lys_set_implemented(mod, features, &ctx->unres);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(ctx->flags & LY_CTX_EXPLICIT_COMPILE)) {
        /* create dep set for the module and mark all the modules that will be (re)compiled */
        LY_CHECK_GOTO(ret = lys_unres_dep_sets_create(ctx, &ctx->unres.dep_sets, mod), cleanup);

        /* (re)compile the whole dep set (other dep sets will have no modules marked for compilation) */
        LY_CHECK_GOTO(ret = lys_compile_depset_all(ctx, &ctx->unres), cleanup);

        /* unres resolved */
        lys_unres_glob_erase(&ctx->unres);
    }

cleanup:
    if (ret) {
        lys_unres_glob_revert(ctx, &ctx->unres);
        lys_unres_glob_erase(&ctx->unres);
    } else if (module) {
        *module = mod;
    }
    return ret;
}